

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawBuffersIndexedDefaultState.cpp
# Opt level: O0

IterateResult __thiscall
glcts::DrawBuffersIndexedDefaultState::iterate(DrawBuffersIndexedDefaultState *this)

{
  Context *context;
  bool bVar1;
  int iVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestLog *log;
  GLenum error_code;
  undefined1 local_50 [8];
  BlendMaskStateMachine state;
  GLint maxDrawBuffers;
  Functions *gl;
  DrawBuffersIndexedDefaultState *this_local;
  
  pRVar3 = deqp::Context::getRenderContext
                     ((this->super_DrawBuffersIndexedBase).super_TestCaseBase.m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  state.testLog._4_4_ = 0;
  (**(code **)(CONCAT44(extraout_var,iVar2) + 0x868))
            (0x8824,(undefined1 *)((long)&state.testLog + 4));
  if (state.testLog._4_4_ < 4) {
    tcu::TestContext::setTestResult
              ((this->super_DrawBuffersIndexedBase).super_TestCaseBase.super_TestCase.super_TestNode
               .m_testCtx,QP_TEST_RESULT_FAIL,"Minimum number of draw buffers too low");
  }
  else {
    context = (this->super_DrawBuffersIndexedBase).super_TestCaseBase.m_context;
    log = tcu::TestContext::getLog
                    ((this->super_DrawBuffersIndexedBase).super_TestCaseBase.super_TestCase.
                     super_TestNode.m_testCtx);
    DrawBuffersIndexedBase::BlendMaskStateMachine::BlendMaskStateMachine
              ((BlendMaskStateMachine *)local_50,context,log,state.testLog._4_4_);
    bVar1 = DrawBuffersIndexedBase::BlendMaskStateMachine::CheckAll
                      ((BlendMaskStateMachine *)local_50);
    if (bVar1) {
      iVar2 = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
      if (iVar2 == 0) {
        tcu::TestContext::setTestResult
                  ((this->super_DrawBuffersIndexedBase).super_TestCaseBase.super_TestCase.
                   super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
      }
      else {
        tcu::TestContext::setTestResult
                  ((this->super_DrawBuffersIndexedBase).super_TestCaseBase.super_TestCase.
                   super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,"Some functions generated error");
      }
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_DrawBuffersIndexedBase).super_TestCaseBase.super_TestCase.
                 super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,"Default state verification failed");
    }
    DrawBuffersIndexedBase::BlendMaskStateMachine::~BlendMaskStateMachine
              ((BlendMaskStateMachine *)local_50);
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult DrawBuffersIndexedDefaultState::iterate()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	// Check number of available draw buffers
	glw::GLint maxDrawBuffers = 0;
	gl.getIntegerv(GL_MAX_DRAW_BUFFERS, &maxDrawBuffers);
	if (maxDrawBuffers < 4)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Minimum number of draw buffers too low");
		return STOP;
	}

	BlendMaskStateMachine state(m_context, m_testCtx.getLog(), maxDrawBuffers);
	if (!state.CheckAll())
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Default state verification failed");
		return STOP;
	}

	// Check for error
	glw::GLenum error_code = gl.getError();
	if (error_code != GL_NO_ERROR)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Some functions generated error");
		return STOP;
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}